

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void freeP4(sqlite3 *db,int p4type,void *p4)

{
  switch(p4type) {
  case -0x11:
    if (*(void **)((long)p4 + 8) != (void *)0x0) {
      sqlite3DbFreeNN(db,*(void **)((long)p4 + 8));
    }
    sqlite3DbFreeNN(db,p4);
    return;
  case -0x10:
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3DeleteTable(db,(Table *)p4);
      return;
    }
    break;
  case -0xf:
    freeP4FuncCtx(db,(sqlite3_context *)p4);
    return;
  case -0xe:
  case -0xd:
  case -0xc:
  case -6:
    if (p4 != (void *)0x0) {
LAB_00141aec:
      sqlite3DbNNFreeNN(db,p4);
      return;
    }
    break;
  case -0xb:
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3VtabUnlock((VTable *)p4);
      return;
    }
    break;
  case -10:
    if (db->pnBytesFreed != (int *)0x0) {
      freeP4Mem(db,(Mem *)p4);
      return;
    }
    sqlite3ValueFree((sqlite3_value *)p4);
    return;
  case -8:
    if (((p4 != (void *)0x0) && (db->pnBytesFreed == (int *)0x0)) &&
       (*(int *)p4 = *p4 + -1, *p4 == 0)) {
      db = *(sqlite3 **)((long)p4 + 0x10);
      goto LAB_00141aec;
    }
    break;
  case -7:
    if ((*(byte *)((long)p4 + 4) & 0x10) != 0) goto LAB_00141aec;
  }
  return;
}

Assistant:

static void freeP4(sqlite3 *db, int p4type, void *p4){
  assert( db );
  switch( p4type ){
    case P4_FUNCCTX: {
      freeP4FuncCtx(db, (sqlite3_context*)p4);
      break;
    }
    case P4_REAL:
    case P4_INT64:
    case P4_DYNAMIC:
    case P4_INTARRAY: {
      if( p4 ) sqlite3DbNNFreeNN(db, p4);
      break;
    }
    case P4_KEYINFO: {
      if( db->pnBytesFreed==0 ) sqlite3KeyInfoUnref((KeyInfo*)p4);
      break;
    }
#ifdef SQLITE_ENABLE_CURSOR_HINTS
    case P4_EXPR: {
      sqlite3ExprDelete(db, (Expr*)p4);
      break;
    }
#endif
    case P4_FUNCDEF: {
      freeEphemeralFunction(db, (FuncDef*)p4);
      break;
    }
    case P4_MEM: {
      if( db->pnBytesFreed==0 ){
        sqlite3ValueFree((sqlite3_value*)p4);
      }else{
        freeP4Mem(db, (Mem*)p4);
      }
      break;
    }
    case P4_VTAB : {
      if( db->pnBytesFreed==0 ) sqlite3VtabUnlock((VTable *)p4);
      break;
    }
    case P4_TABLEREF: {
      if( db->pnBytesFreed==0 ) sqlite3DeleteTable(db, (Table*)p4);
      break;
    }
    case P4_SUBRTNSIG: {
      SubrtnSig *pSig = (SubrtnSig*)p4;
      sqlite3DbFree(db, pSig->zAff);
      sqlite3DbFree(db, pSig);
      break;
    }
  }
}